

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

optional<VariableDefinition> * __thiscall
Scope::findLocally(optional<VariableDefinition> *__return_storage_ptr__,Scope *this,
                  string *variableName,bool considerPartiallyBound)

{
  bool bVar1;
  undefined8 uVar2;
  iterator iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->localScope)._M_h,variableName);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
    super__Optional_payload<VariableDefinition,_true,_false,_false>.
    super__Optional_payload_base<VariableDefinition>._M_engaged = false;
  }
  else {
    uVar2 = *(undefined8 *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
                    ._M_cur + 0x28);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
                      ._M_cur + 0x30);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    bVar1 = *(bool *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VariableDefinition>,_true>
                            ._M_cur + 0x38);
    bVar4 = (considerPartiallyBound | bVar1) == 1;
    if (bVar4) {
      (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
      super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar2;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>).
              _M_payload.super__Optional_payload<VariableDefinition,_true,_false,_false>.
              super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
              super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi = this_00;
      (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound = bVar1;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
    super__Optional_payload<VariableDefinition,_true,_false,_false>.
    super__Optional_payload_base<VariableDefinition>._M_engaged = bVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<VariableDefinition> findLocally(const std::string & variableName, bool considerPartiallyBound) {

    auto find = this->localScope.find(variableName);

    if (find == this->localScope.end()) {
      return std::nullopt;
    }

    VariableDefinition vd = find->second;

    if (!vd.isFullyBound) {
      if (considerPartiallyBound) {
        return vd;
      }

      return std::nullopt;
    }

    return vd;
  }